

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O0

void __thiscall CTcSrcFile::~CTcSrcFile(CTcSrcFile *this)

{
  CCharmap *in_RDI;
  
  in_RDI->_vptr_CCharmap = (_func_int **)&PTR__CTcSrcFile_00436c78;
  if ((in_RDI[1]._vptr_CCharmap != (_func_int **)0x0) &&
     (in_RDI[1]._vptr_CCharmap != (_func_int **)0x0)) {
    (**(code **)(*in_RDI[1]._vptr_CCharmap + 8))();
  }
  if (*(long *)&in_RDI[0x42].ref_cnt_ != 0) {
    CCharmap::release_ref(in_RDI);
  }
  CTcSrcObject::~CTcSrcObject((CTcSrcObject *)in_RDI);
  return;
}

Assistant:

CTcSrcFile::~CTcSrcFile()
{
    /* close my source file */
    if (fp_ != 0)
        delete fp_;

    /* release my character mapper */
    if (mapper_ != 0)
        mapper_->release_ref();
}